

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O0

void CheckNinjaVersion(string *version)

{
  char *pcVar1;
  undefined8 uVar2;
  int local_54;
  int local_50;
  int file_minor;
  int file_major;
  allocator<char> local_39;
  string local_38;
  int local_18;
  int local_14;
  int bin_minor;
  int bin_major;
  string *version_local;
  
  pcVar1 = kNinjaVersion;
  _bin_minor = version;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
  ParseVersion(&local_38,&local_14,&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  ParseVersion(_bin_minor,&local_50,&local_54);
  pcVar1 = kNinjaVersion;
  if (local_50 < local_14) {
    uVar2 = std::__cxx11::string::c_str();
    Warning("ninja executable version (%s) greater than build file ninja_required_version (%s); versions may be incompatible."
            ,pcVar1,uVar2);
  }
  else if (((local_14 == local_50) && (local_18 < local_54)) || (local_14 < local_50)) {
    uVar2 = std::__cxx11::string::c_str();
    Fatal("ninja version (%s) incompatible with build file ninja_required_version version (%s).",
          pcVar1,uVar2);
  }
  return;
}

Assistant:

void CheckNinjaVersion(const string& version) {
  int bin_major, bin_minor;
  ParseVersion(kNinjaVersion, &bin_major, &bin_minor);
  int file_major, file_minor;
  ParseVersion(version, &file_major, &file_minor);

  if (bin_major > file_major) {
    Warning("ninja executable version (%s) greater than build file "
            "ninja_required_version (%s); versions may be incompatible.",
            kNinjaVersion, version.c_str());
    return;
  }

  if ((bin_major == file_major && bin_minor < file_minor) ||
      bin_major < file_major) {
    Fatal("ninja version (%s) incompatible with build file "
          "ninja_required_version version (%s).",
          kNinjaVersion, version.c_str());
  }
}